

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

void __thiscall duckdb_re2::BitState::Push(BitState *this,int id,char *p)

{
  int iVar1;
  Job *pJVar2;
  ostream *this_00;
  long lVar3;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (((int)(this->job_).ptr_._M_t.
            super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
            .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
            super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false> <=
       this->njob_) &&
     (GrowStack(this),
     (int)(this->job_).ptr_._M_t.
          super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
          super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
          super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false> <=
     this->njob_)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GrowStack() failed: ",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"njob_ = ",8);
    this_00 = (ostream *)std::ostream::operator<<(local_198,this->njob_);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"job_.size() = ",0xe);
    std::ostream::operator<<
              (this_00,(int)(this->job_).ptr_._M_t.
                            super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                            .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
                            super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false>
              );
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    return;
  }
  if ((-1 < id) && (lVar3 = (long)this->njob_, 0 < lVar3)) {
    pJVar2 = (this->job_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl;
    if (pJVar2[lVar3 + -1].id == id) {
      iVar1 = pJVar2[lVar3 + -1].rle;
      if (((long)iVar1 != 0x7fffffff) && (pJVar2[lVar3 + -1].p + (long)iVar1 + 1 == p)) {
        pJVar2[lVar3 + -1].rle = iVar1 + 1;
        return;
      }
    }
  }
  iVar1 = this->njob_;
  this->njob_ = iVar1 + 1;
  pJVar2 = (this->job_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl;
  pJVar2[iVar1].id = id;
  pJVar2[iVar1].rle = 0;
  pJVar2[iVar1].p = p;
  return;
}

Assistant:

void BitState::Push(int id, const char* p) {
  if (njob_ >= job_.size()) {
    GrowStack();
    if (njob_ >= job_.size()) {
      LOG(DFATAL) << "GrowStack() failed: "
                  << "njob_ = " << njob_ << ", "
                  << "job_.size() = " << job_.size();
      return;
    }
  }

  // If id < 0, it's undoing a Capture,
  // so we mustn't interfere with that.
  if (id >= 0 && njob_ > 0) {
    Job* top = &job_[njob_-1];
    if (id == top->id &&
        p == top->p + top->rle + 1 &&
        top->rle < std::numeric_limits<int>::max()) {
      ++top->rle;
      return;
    }
  }

  Job* top = &job_[njob_++];
  top->id = id;
  top->rle = 0;
  top->p = p;
}